

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::StreamingConcatenationExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,StreamingConcatenationExpressionSyntax *this,
          size_t index)

{
  __index_type _Var1;
  undefined4 uVar2;
  uint32_t uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  switch(index) {
  case 0:
    uVar2._0_2_ = (this->openBrace).kind;
    uVar2._2_1_ = (this->openBrace).field_0x2;
    uVar2._3_1_ = (this->openBrace).numFlags;
    uVar3 = (this->openBrace).rawLen;
    uVar4 = *(undefined4 *)&(this->openBrace).info;
    uVar5 = *(undefined4 *)((long)&(this->openBrace).info + 4);
    break;
  case 1:
    uVar2._0_2_ = (this->operatorToken).kind;
    uVar2._2_1_ = (this->operatorToken).field_0x2;
    uVar2._3_1_ = (this->operatorToken).numFlags;
    uVar3 = (this->operatorToken).rawLen;
    uVar4 = *(undefined4 *)&(this->operatorToken).info;
    uVar5 = *(undefined4 *)((long)&(this->operatorToken).info + 4);
    break;
  case 2:
    *(ExpressionSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         this->sliceSize;
    goto LAB_002ddfb8;
  case 3:
    uVar2._0_2_ = (this->innerOpenBrace).kind;
    uVar2._2_1_ = (this->innerOpenBrace).field_0x2;
    uVar2._3_1_ = (this->innerOpenBrace).numFlags;
    uVar3 = (this->innerOpenBrace).rawLen;
    uVar4 = *(undefined4 *)&(this->innerOpenBrace).info;
    uVar5 = *(undefined4 *)((long)&(this->innerOpenBrace).info + 4);
    break;
  case 4:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(this->expressions).super_SyntaxListBase.super_SyntaxNode;
LAB_002ddfb8:
    _Var1 = '\x01';
    goto LAB_002ddfe4;
  case 5:
    uVar2._0_2_ = (this->innerCloseBrace).kind;
    uVar2._2_1_ = (this->innerCloseBrace).field_0x2;
    uVar2._3_1_ = (this->innerCloseBrace).numFlags;
    uVar3 = (this->innerCloseBrace).rawLen;
    uVar4 = *(undefined4 *)&(this->innerCloseBrace).info;
    uVar5 = *(undefined4 *)((long)&(this->innerCloseBrace).info + 4);
    break;
  case 6:
    uVar2._0_2_ = (this->closeBrace).kind;
    uVar2._2_1_ = (this->closeBrace).field_0x2;
    uVar2._3_1_ = (this->closeBrace).numFlags;
    uVar3 = (this->closeBrace).rawLen;
    uVar4 = *(undefined4 *)&(this->closeBrace).info;
    uVar5 = *(undefined4 *)((long)&(this->closeBrace).info + 4);
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_002ddfe2;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar2;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar3;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar5;
LAB_002ddfe2:
  _Var1 = '\0';
LAB_002ddfe4:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax StreamingConcatenationExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return openBrace;
        case 1: return operatorToken;
        case 2: return sliceSize;
        case 3: return innerOpenBrace;
        case 4: return &expressions;
        case 5: return innerCloseBrace;
        case 6: return closeBrace;
        default: return nullptr;
    }
}